

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBadTypeAttributes.cpp
# Opt level: O0

void testBadTypeAttributes(string *tempDir)

{
  ostream *poVar1;
  char *in_stack_00000090;
  char *in_stack_000000a0;
  
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "Testing whether bad type attributes are fixed on read... ");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  anon_unknown.dwarf_3b1cf::testTiledWithBadAttribute(in_stack_00000090);
  anon_unknown.dwarf_3b1cf::testTiledWithBadAttribute(in_stack_00000090);
  anon_unknown.dwarf_3b1cf::testTiledWithBadAttribute(in_stack_00000090);
  anon_unknown.dwarf_3b1cf::testScanLineWithBadAttribute(in_stack_000000a0);
  anon_unknown.dwarf_3b1cf::testScanLineWithBadAttribute(in_stack_000000a0);
  anon_unknown.dwarf_3b1cf::testScanLineWithBadAttribute(in_stack_000000a0);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "Testing whether bad type attributes are fixed on write... ");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  anon_unknown.dwarf_3b1cf::testWriteBadTypes();
  poVar1 = std::operator<<((ostream *)&std::cout,"ok\n");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void
testBadTypeAttributes (const std::string& tempDir)
{
    cout << "Testing whether bad type attributes are fixed on read... " << endl;

    testTiledWithBadAttribute (ILM_IMF_TEST_IMAGEDIR
                               "tiled_with_scanlineimage_type.exr");
    testTiledWithBadAttribute (ILM_IMF_TEST_IMAGEDIR
                               "tiled_with_deepscanline_type.exr");
    testTiledWithBadAttribute (ILM_IMF_TEST_IMAGEDIR
                               "tiled_with_deeptile_type.exr");

    testScanLineWithBadAttribute (ILM_IMF_TEST_IMAGEDIR
                                  "scanline_with_tiledimage_type.exr");
    testScanLineWithBadAttribute (ILM_IMF_TEST_IMAGEDIR
                                  "scanline_with_deeptiled_type.exr");
    testScanLineWithBadAttribute (ILM_IMF_TEST_IMAGEDIR
                                  "scanline_with_deepscanline_type.exr");

    cout << "Testing whether bad type attributes are fixed on write... "
         << endl;

    testWriteBadTypes ();

    cout << "ok\n" << endl;
}